

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_scan_version_directive_number
              (yaml_parser_t *parser,yaml_mark_t start_mark,int *number)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  
  if ((parser->unread != 0) || (iVar5 = yaml_parser_update_buffer(parser,1), iVar5 != 0)) {
    lVar9 = 0;
    iVar5 = 0;
    while( true ) {
      pbVar4 = (parser->buffer).pointer;
      bVar2 = *pbVar4;
      if (9 < (byte)(bVar2 - 0x30)) break;
      if (lVar9 == -9) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a %YAML directive";
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        pcVar7 = "found extremely long version number";
        goto LAB_0019b59f;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      sVar8 = parser->unread - 1;
      parser->unread = sVar8;
      bVar3 = *pbVar4;
      lVar10 = 1;
      if ((((char)bVar3 < '\0') && (lVar10 = 2, (bVar3 & 0xe0) != 0xc0)) &&
         (lVar10 = 3, (bVar3 & 0xf0) != 0xe0)) {
        lVar10 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar4 + lVar10;
      if ((sVar8 == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0)) {
        return 0;
      }
      iVar5 = iVar5 * 10 + (uint)bVar2 + -0x30;
      lVar9 = lVar9 + -1;
    }
    if (lVar9 != 0) {
      *number = iVar5;
      return 1;
    }
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a %YAML directive";
    (parser->context_mark).index = start_mark.index;
    (parser->context_mark).line = start_mark.line;
    (parser->context_mark).column = start_mark.column;
    pcVar7 = "did not find expected version number";
LAB_0019b59f:
    parser->problem = pcVar7;
    sVar8 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar8;
    (parser->problem_mark).column = (parser->mark).column;
  }
  return 0;
}

Assistant:

static int
yaml_parser_scan_version_directive_number(yaml_parser_t *parser,
        yaml_mark_t start_mark, int *number)
{
    int value = 0;
    size_t length = 0;

    /* Repeat while the next character is digit. */

    if (!CACHE(parser, 1)) return 0;

    while (IS_DIGIT(parser->buffer))
    {
        /* Check if the number is too long. */

        if (++length > MAX_NUMBER_LENGTH) {
            return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                    start_mark, "found extremely long version number");
        }

        value = value*10 + AS_DIGIT(parser->buffer);

        SKIP(parser);

        if (!CACHE(parser, 1)) return 0;
    }

    /* Check if the number was present. */

    if (!length) {
        return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                start_mark, "did not find expected version number");
    }

    *number = value;

    return 1;
}